

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O3

int __thiscall ncnn::Convolution1D_x86_avx::create_pipeline(Convolution1D_x86_avx *this,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  Allocator *pAVar7;
  ulong uVar8;
  bool bVar9;
  int k_1;
  uint uVar10;
  uint uVar11;
  void *pvVar12;
  ulong uVar13;
  long lVar14;
  undefined4 *puVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  void *pvVar19;
  int k;
  uint uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  void *pvVar24;
  long lVar25;
  void *pvVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  undefined4 *puVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  void *pvVar39;
  void *pvVar40;
  long lVar41;
  bool bVar42;
  int iVar43;
  int iVar44;
  ulong uVar45;
  void *pvVar46;
  long lVar47;
  long lVar48;
  void *pvVar49;
  ulong uVar50;
  int iVar51;
  void *pvVar52;
  undefined4 *puVar53;
  ulong uVar54;
  void *pvVar55;
  long lVar56;
  void *pvVar57;
  long lVar58;
  undefined4 *puVar59;
  void *pvVar60;
  long lVar61;
  int iVar62;
  int iVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long local_180;
  void *local_178;
  void *local_170;
  void *local_160;
  void *local_150;
  void *local_148;
  void *local_138;
  void *local_130;
  void *local_128;
  long local_118;
  int local_110;
  int local_10c;
  long local_108;
  uint local_100;
  int local_e0;
  int local_d8;
  int local_d0;
  int local_c8;
  
  if ((this->super_Convolution1D).dynamic_weight != 0) {
    return 0;
  }
  uVar1 = (this->super_Convolution1D).kernel_w;
  lVar27 = (long)(int)uVar1;
  uVar54 = (ulong)uVar1;
  uVar8 = (long)(this->super_Convolution1D).weight_data_size / (long)(int)uVar1;
  uVar11 = (this->super_Convolution1D).num_output;
  uVar45 = (ulong)(int)uVar11;
  uVar8 = (long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) / (long)(int)uVar11
  ;
  uVar10 = (uint)uVar8;
  uVar37 = uVar8 & 0xffffffff;
  if ((long)uVar45 < 8) {
    uVar20 = uVar10;
    if ((int)uVar11 < 4) {
      if ((int)uVar11 < 2) {
        uVar18 = uVar11;
        if ((int)uVar10 < 8) {
          if ((int)uVar10 < 4) {
            uVar21 = uVar1;
            if (1 < (int)uVar10) {
              uVar21 = uVar1 * 2;
              uVar20 = (uVar10 & 1) + 1;
            }
          }
          else {
            uVar21 = uVar1 * 4;
            uVar20 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
          }
        }
        else {
          uVar21 = uVar1 * 8;
          uVar20 = (uVar10 & 1) + (int)(uVar37 >> 3) + ((uint)(uVar37 >> 2) & 1) +
                   (uint)((uVar10 >> 1 & 1) != 0);
        }
      }
      else {
        if ((int)uVar10 < 8) {
          if ((int)uVar10 < 4) {
            if ((int)uVar10 < 2) {
              uVar21 = uVar1 * 2;
              uVar18 = (uVar11 & 1) + 1;
              goto LAB_00546fb0;
            }
            uVar21 = uVar1 * 4;
            uVar20 = (uVar10 & 1) + 1;
          }
          else {
            uVar20 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
            uVar21 = uVar1 * 8;
          }
        }
        else {
          uVar21 = uVar1 << 4;
          uVar20 = (uVar10 & 1) + (int)(uVar37 >> 3) + ((uint)(uVar37 >> 2) & 1) +
                   (uint)((uVar10 >> 1 & 1) != 0);
        }
        uVar18 = (uVar11 & 1) + 1;
      }
    }
    else {
      if ((int)uVar10 < 8) {
        if ((int)uVar10 < 4) {
          if ((int)uVar10 < 2) {
            uVar21 = uVar1 * 4;
            uVar18 = (uVar11 & 1) + 1 + (uint)((uVar11 >> 1 & 1) != 0);
            goto LAB_00546fb0;
          }
          uVar21 = uVar1 * 8;
          uVar20 = (uVar10 & 1) + 1;
        }
        else {
          uVar21 = uVar1 << 4;
          uVar20 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
        }
      }
      else {
        uVar21 = uVar1 << 5;
        uVar20 = (uVar10 & 1) + (int)(uVar37 >> 3) + ((uint)(uVar37 >> 2) & 1) +
                 (uint)((uVar10 >> 1 & 1) != 0);
      }
      uVar18 = (uVar11 & 1) + 1 + (uint)((uVar11 >> 1 & 1) != 0);
    }
LAB_00546fb0:
    uVar37 = 0;
    Mat::create(&this->weight_data_tm,uVar21,uVar20,uVar18,4,(Allocator *)0x0);
    goto LAB_00546fb8;
  }
  if ((int)uVar10 < 8) {
    if (3 < (int)uVar10) {
      iVar29 = uVar1 << 5;
      uVar20 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
      goto LAB_005464d6;
    }
    if (1 < (int)uVar10) {
      iVar29 = uVar1 << 4;
      uVar20 = (uVar10 & 1) + 1;
      goto LAB_005464d6;
    }
    iVar29 = uVar1 * 8;
    iVar16 = (uVar11 & 1) + (uVar11 >> 3) + (uVar11 >> 2 & 1) + (uint)((uVar11 >> 1 & 1) != 0);
    uVar20 = uVar10;
  }
  else {
    iVar29 = uVar1 << 6;
    uVar20 = (uVar10 & 1) + ((uint)(uVar8 >> 3) & 0x1fffffff) + ((uint)(uVar37 >> 2) & 1) +
             (uint)((uVar10 >> 1 & 1) != 0);
LAB_005464d6:
    iVar16 = (uVar11 & 1) + (uVar11 >> 3) + (uVar11 >> 2 & 1) + (uint)((uVar11 >> 1 & 1) != 0);
  }
  Mat::create(&this->weight_data_tm,iVar29,uVar20,iVar16,4,(Allocator *)0x0);
  pvVar2 = (this->super_Convolution1D).weight_data.data;
  pvVar3 = (this->weight_data_tm).data;
  iVar17 = uVar10 * uVar1;
  sVar4 = (this->weight_data_tm).elemsize;
  sVar5 = (this->weight_data_tm).cstep;
  lVar22 = (long)(int)(uVar1 * 8);
  lVar30 = (long)(int)(uVar1 * 4);
  lVar36 = (long)(int)(uVar1 * 2);
  iVar43 = uVar1 * uVar10;
  iVar29 = iVar43 * 8;
  local_10c = iVar43 * 2;
  local_c8 = iVar43 * 3;
  iVar43 = iVar43 * 4;
  local_d8 = uVar1 * uVar10;
  local_110 = local_d8 * 5;
  local_d0 = local_d8 * 7;
  local_d8 = local_d8 * 6;
  lVar35 = lVar27 * 4;
  iVar16 = 0;
  uVar50 = 0;
  local_e0 = iVar17;
  do {
    uVar20 = (uint)uVar50;
    puVar31 = (undefined4 *)((uVar50 >> 3) * sVar4 * sVar5 + (long)pvVar3);
    local_160 = (void *)((long)(int)(iVar17 * uVar20) * 4 + (long)pvVar2);
    local_170 = (void *)((long)pvVar2 + (long)(int)((uVar20 | 1) * iVar17) * 4);
    local_178 = (void *)((long)pvVar2 + (long)(int)((uVar20 | 2) * iVar17) * 4);
    local_130 = (void *)((long)pvVar2 + (long)(int)((uVar20 | 3) * iVar17) * 4);
    local_148 = (void *)((long)pvVar2 + (long)(int)((uVar20 | 4) * iVar17) * 4);
    local_150 = (void *)((long)pvVar2 + (long)(int)((uVar20 | 5) * iVar17) * 4);
    local_138 = (void *)((long)(int)((uVar20 | 6) * iVar17) * 4 + (long)pvVar2);
    local_128 = (void *)((long)(int)((uVar20 | 7) * iVar17) * 4 + (long)pvVar2);
    if ((int)uVar10 < 8) {
      uVar20 = 0;
    }
    else {
      local_180 = 0;
      iVar51 = 0;
      do {
        if (0 < (int)uVar1) {
          uVar37 = 0;
          lVar38 = local_180;
          do {
            puVar59 = puVar31;
            lVar64 = 0;
            lVar32 = lVar38;
            do {
              *(undefined4 *)((long)puVar59 + lVar64) =
                   *(undefined4 *)((long)pvVar2 + lVar32 + (long)iVar16 * 4);
              *(undefined4 *)((long)puVar59 + lVar64 + 4) =
                   *(undefined4 *)((long)pvVar2 + lVar32 + (long)local_e0 * 4);
              *(undefined4 *)((long)puVar59 + lVar64 + 8) =
                   *(undefined4 *)((long)pvVar2 + lVar32 + (long)local_10c * 4);
              *(undefined4 *)((long)puVar59 + lVar64 + 0xc) =
                   *(undefined4 *)((long)pvVar2 + lVar32 + (long)local_c8 * 4);
              *(undefined4 *)((long)puVar59 + lVar64 + 0x10) =
                   *(undefined4 *)((long)pvVar2 + lVar32 + (long)iVar43 * 4);
              *(undefined4 *)((long)puVar59 + lVar64 + 0x14) =
                   *(undefined4 *)((long)pvVar2 + lVar32 + (long)local_110 * 4);
              *(undefined4 *)((long)puVar59 + lVar64 + 0x18) =
                   *(undefined4 *)((long)pvVar2 + lVar32 + (long)local_d8 * 4);
              *(undefined4 *)((long)puVar59 + lVar64 + 0x1c) =
                   *(undefined4 *)((long)pvVar2 + lVar32 + (long)local_d0 * 4);
              lVar64 = lVar64 + 0x20;
              lVar32 = lVar32 + lVar35;
            } while ((int)lVar64 != 0x100);
            uVar37 = uVar37 + 1;
            lVar38 = lVar38 + 4;
            puVar31 = (undefined4 *)((long)puVar59 + lVar64);
          } while (uVar37 != uVar54);
          puVar31 = (undefined4 *)((long)puVar59 + lVar64);
        }
        local_160 = (void *)((long)local_160 + lVar22 * 4);
        local_170 = (void *)((long)local_170 + lVar22 * 4);
        local_178 = (void *)((long)local_178 + lVar22 * 4);
        local_130 = (void *)((long)local_130 + lVar22 * 4);
        local_148 = (void *)((long)local_148 + lVar22 * 4);
        local_150 = (void *)((long)local_150 + lVar22 * 4);
        local_138 = (void *)((long)local_138 + lVar22 * 4);
        local_128 = (void *)((long)local_128 + lVar22 * 4);
        iVar44 = iVar51 + 0xf;
        local_180 = local_180 + lVar22 * 4;
        uVar20 = uVar10 & 0xfffffff8;
        iVar51 = iVar51 + 8;
      } while (iVar44 < (int)uVar10);
    }
    uVar37 = uVar8 & 0xffffffff;
    pvVar19 = local_130;
    pvVar12 = local_170;
    pvVar26 = local_150;
    pvVar49 = local_178;
    pvVar57 = local_128;
    pvVar24 = local_148;
    pvVar55 = local_138;
    pvVar60 = local_160;
    uVar21 = uVar10;
    if ((int)(uVar20 | 3) < (int)uVar10) {
      local_118 = 0;
      uVar18 = uVar20;
      do {
        if ((int)uVar1 < 1) {
          uVar21 = (uint)uVar37;
        }
        else {
          uVar37 = 0;
          lVar38 = local_118;
          do {
            puVar59 = puVar31;
            lVar64 = 0;
            lVar32 = lVar38;
            do {
              *(undefined4 *)((long)puVar59 + lVar64) = *(undefined4 *)((long)local_160 + lVar32);
              *(undefined4 *)((long)puVar59 + lVar64 + 4) =
                   *(undefined4 *)((long)local_170 + lVar32);
              *(undefined4 *)((long)puVar59 + lVar64 + 8) =
                   *(undefined4 *)((long)local_178 + lVar32);
              *(undefined4 *)((long)puVar59 + lVar64 + 0xc) =
                   *(undefined4 *)((long)local_130 + lVar32);
              *(undefined4 *)((long)puVar59 + lVar64 + 0x10) =
                   *(undefined4 *)((long)local_148 + lVar32);
              *(undefined4 *)((long)puVar59 + lVar64 + 0x14) =
                   *(undefined4 *)((long)local_150 + lVar32);
              *(undefined4 *)((long)puVar59 + lVar64 + 0x18) =
                   *(undefined4 *)((long)local_138 + lVar32);
              *(undefined4 *)((long)puVar59 + lVar64 + 0x1c) =
                   *(undefined4 *)((long)local_128 + lVar32);
              lVar64 = lVar64 + 0x20;
              lVar32 = lVar32 + lVar35;
            } while ((int)lVar64 != 0x80);
            uVar37 = uVar37 + 1;
            lVar38 = lVar38 + 4;
            puVar31 = (undefined4 *)((long)puVar59 + lVar64);
          } while (uVar37 != uVar54);
          puVar31 = (undefined4 *)((long)puVar59 + lVar64);
          uVar21 = uVar10;
        }
        pvVar60 = (void *)((long)pvVar60 + lVar30 * 4);
        pvVar12 = (void *)((long)pvVar12 + lVar30 * 4);
        pvVar49 = (void *)((long)pvVar49 + lVar30 * 4);
        pvVar19 = (void *)((long)pvVar19 + lVar30 * 4);
        pvVar24 = (void *)((long)pvVar24 + lVar30 * 4);
        pvVar26 = (void *)((long)pvVar26 + lVar30 * 4);
        pvVar55 = (void *)((long)pvVar55 + lVar30 * 4);
        pvVar57 = (void *)((long)pvVar57 + lVar30 * 4);
        uVar20 = uVar18 + 4;
        iVar51 = uVar18 + 7;
        local_118 = local_118 + lVar30 * 4;
        uVar37 = (ulong)uVar21;
        uVar18 = uVar20;
      } while (iVar51 < (int)uVar21);
    }
    pvVar39 = pvVar26;
    pvVar46 = pvVar55;
    pvVar52 = pvVar60;
    local_170 = pvVar49;
    local_160 = pvVar12;
    local_150 = pvVar24;
    local_148 = pvVar57;
    local_130 = pvVar19;
    if ((int)(uVar20 | 1) < (int)uVar21) {
      local_178 = (void *)0x0;
      uVar21 = uVar20;
      do {
        if (0 < (int)uVar1) {
          uVar37 = 0;
          pvVar40 = local_178;
          do {
            lVar38 = (long)pvVar40;
            bVar9 = true;
            do {
              bVar42 = bVar9;
              *puVar31 = *(undefined4 *)((long)pvVar60 + lVar38);
              puVar31[1] = *(undefined4 *)((long)pvVar12 + lVar38);
              puVar31[2] = *(undefined4 *)((long)pvVar49 + lVar38);
              puVar31[3] = *(undefined4 *)((long)pvVar19 + lVar38);
              puVar31[4] = *(undefined4 *)((long)pvVar24 + lVar38);
              puVar31[5] = *(undefined4 *)((long)pvVar26 + lVar38);
              puVar31[6] = *(undefined4 *)((long)pvVar55 + lVar38);
              puVar31[7] = *(undefined4 *)((long)pvVar57 + lVar38);
              puVar31 = puVar31 + 8;
              lVar38 = lVar38 + lVar35;
              bVar9 = false;
            } while (bVar42);
            uVar37 = uVar37 + 1;
            pvVar40 = (void *)((long)pvVar40 + 4);
          } while (uVar37 != uVar54);
        }
        pvVar52 = (void *)((long)pvVar52 + lVar36 * 4);
        local_160 = (void *)((long)local_160 + lVar36 * 4);
        local_170 = (void *)((long)local_170 + lVar36 * 4);
        local_130 = (void *)((long)local_130 + lVar36 * 4);
        local_150 = (void *)((long)local_150 + lVar36 * 4);
        pvVar39 = (void *)((long)pvVar39 + lVar36 * 4);
        pvVar46 = (void *)((long)pvVar46 + lVar36 * 4);
        local_148 = (void *)((long)local_148 + lVar36 * 4);
        uVar20 = uVar21 + 2;
        iVar51 = uVar21 + 3;
        local_178 = (void *)((long)local_178 + lVar36 * 4);
        uVar21 = uVar20;
      } while (iVar51 < (int)uVar10);
    }
    if ((int)uVar20 < (int)uVar10) {
      do {
        if (0 < (int)uVar1) {
          lVar38 = 0;
          puVar59 = puVar31;
          do {
            puVar15 = puVar59;
            puVar59 = puVar31 + lVar38 * 2;
            *puVar59 = *(undefined4 *)((long)pvVar52 + lVar38);
            puVar59[1] = *(undefined4 *)((long)local_160 + lVar38);
            puVar59[2] = *(undefined4 *)((long)local_170 + lVar38);
            puVar59[3] = *(undefined4 *)((long)local_130 + lVar38);
            puVar59[4] = *(undefined4 *)((long)local_150 + lVar38);
            puVar59[5] = *(undefined4 *)((long)pvVar39 + lVar38);
            puVar59[6] = *(undefined4 *)((long)pvVar46 + lVar38);
            puVar59[7] = *(undefined4 *)((long)local_148 + lVar38);
            lVar38 = lVar38 + 4;
            puVar59 = puVar59 + 8;
          } while (uVar54 * 4 != lVar38);
          puVar31 = puVar15 + 8;
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar10);
    }
    uVar37 = uVar50 + 8;
    uVar23 = uVar50 + 0xf;
    iVar16 = iVar16 + iVar29;
    local_e0 = local_e0 + iVar29;
    local_10c = local_10c + iVar29;
    local_c8 = local_c8 + iVar29;
    iVar43 = iVar43 + iVar29;
    local_110 = local_110 + iVar29;
    local_d0 = local_d0 + iVar29;
    local_d8 = local_d8 + iVar29;
    uVar50 = uVar37;
  } while (uVar23 < uVar45);
LAB_00546fb8:
  uVar21 = (uint)uVar37;
  uVar20 = uVar21 | 3;
  uVar50 = (ulong)uVar20;
  if ((int)uVar20 < (int)uVar11) {
    pvVar2 = (this->super_Convolution1D).weight_data.data;
    pvVar3 = (this->weight_data_tm).data;
    sVar4 = (this->weight_data_tm).elemsize;
    sVar5 = (this->weight_data_tm).cstep;
    iVar51 = uVar10 * uVar1;
    local_100 = uVar10 & 0xfffffff8;
    iVar16 = uVar1 * uVar10;
    iVar29 = iVar16 * 4;
    iVar44 = (uVar21 + 2) * iVar16;
    iVar16 = iVar16 * uVar20;
    lVar22 = (long)(int)(uVar1 * 8) * 4;
    iVar17 = (uVar21 + 1) * uVar1 * uVar10;
    iVar43 = uVar1 * uVar10 * uVar21;
    lVar35 = lVar27 * 4;
    lVar30 = (long)(int)(uVar1 * 4) * 4;
    lVar36 = (long)(int)(uVar1 * 2) * 4;
    uVar23 = uVar37 & 0xffffffff;
    do {
      uVar20 = (uint)uVar23;
      puVar31 = (undefined4 *)
                ((ulong)(((uint)(uVar23 >> 3) & 0x1fffffff) + (uint)((uVar20 >> 2 & 1) != 0)) *
                 sVar4 * sVar5 + (long)pvVar3);
      if ((int)uVar10 < 8) {
        pvVar60 = (void *)((long)pvVar2 + (long)(int)(iVar51 * uVar20) * 4);
        pvVar12 = (void *)((long)pvVar2 + (long)(int)((uVar20 + 1) * iVar51) * 4);
        pvVar49 = (void *)((long)pvVar2 + (long)(int)((uVar20 + 2) * iVar51) * 4);
        pvVar19 = (void *)((long)pvVar2 + (long)((int)uVar50 * iVar51) * 4);
        uVar20 = 0;
      }
      else {
        pvVar19 = (void *)((long)pvVar2 + (long)iVar16 * 4);
        pvVar49 = (void *)((long)pvVar2 + (long)iVar44 * 4);
        pvVar12 = (void *)((long)pvVar2 + (long)iVar17 * 4);
        pvVar60 = (void *)((long)pvVar2 + (long)iVar43 * 4);
        iVar62 = 0;
        do {
          if (0 < (int)uVar1) {
            uVar37 = 0;
            pvVar24 = pvVar60;
            pvVar26 = pvVar12;
            pvVar55 = pvVar49;
            pvVar57 = pvVar19;
            do {
              puVar59 = puVar31;
              lVar38 = 0;
              lVar32 = 0;
              do {
                *(undefined4 *)((long)puVar59 + lVar32) = *(undefined4 *)((long)pvVar24 + lVar38);
                *(undefined4 *)((long)puVar59 + lVar32 + 4) =
                     *(undefined4 *)((long)pvVar26 + lVar38);
                *(undefined4 *)((long)puVar59 + lVar32 + 8) =
                     *(undefined4 *)((long)pvVar55 + lVar38);
                *(undefined4 *)((long)puVar59 + lVar32 + 0xc) =
                     *(undefined4 *)((long)pvVar57 + lVar38);
                lVar32 = lVar32 + 0x10;
                lVar38 = lVar38 + lVar35;
              } while ((int)lVar32 != 0x80);
              uVar37 = uVar37 + 1;
              pvVar57 = (void *)((long)pvVar57 + 4);
              pvVar55 = (void *)((long)pvVar55 + 4);
              pvVar26 = (void *)((long)pvVar26 + 4);
              pvVar24 = (void *)((long)pvVar24 + 4);
              puVar31 = (undefined4 *)((long)puVar59 + lVar32);
            } while (uVar37 != uVar54);
            puVar31 = (undefined4 *)((long)puVar59 + lVar32);
          }
          pvVar60 = (void *)((long)pvVar60 + lVar22);
          pvVar12 = (void *)((long)pvVar12 + lVar22);
          pvVar49 = (void *)((long)pvVar49 + lVar22);
          pvVar19 = (void *)((long)pvVar19 + lVar22);
          iVar63 = iVar62 + 0xf;
          iVar62 = iVar62 + 8;
          uVar20 = local_100;
        } while (iVar63 < (int)uVar10);
      }
      uVar21 = uVar20 | 3;
      while ((int)uVar21 < (int)uVar10) {
        if (0 < (int)uVar1) {
          uVar37 = 0;
          pvVar24 = pvVar60;
          pvVar26 = pvVar12;
          pvVar55 = pvVar19;
          pvVar57 = pvVar49;
          do {
            puVar59 = puVar31;
            lVar38 = 0;
            lVar32 = 0;
            do {
              *(undefined4 *)((long)puVar59 + lVar32) = *(undefined4 *)((long)pvVar24 + lVar38);
              *(undefined4 *)((long)puVar59 + lVar32 + 4) = *(undefined4 *)((long)pvVar26 + lVar38);
              *(undefined4 *)((long)puVar59 + lVar32 + 8) = *(undefined4 *)((long)pvVar57 + lVar38);
              *(undefined4 *)((long)puVar59 + lVar32 + 0xc) =
                   *(undefined4 *)((long)pvVar55 + lVar38);
              lVar32 = lVar32 + 0x10;
              lVar38 = lVar38 + lVar35;
            } while ((int)lVar32 != 0x40);
            uVar37 = uVar37 + 1;
            pvVar55 = (void *)((long)pvVar55 + 4);
            pvVar57 = (void *)((long)pvVar57 + 4);
            pvVar26 = (void *)((long)pvVar26 + 4);
            pvVar24 = (void *)((long)pvVar24 + 4);
            puVar31 = (undefined4 *)((long)puVar59 + lVar32);
          } while (uVar37 != uVar54);
          puVar31 = (undefined4 *)((long)puVar59 + lVar32);
        }
        pvVar60 = (void *)((long)pvVar60 + lVar30);
        pvVar12 = (void *)((long)pvVar12 + lVar30);
        pvVar49 = (void *)((long)pvVar49 + lVar30);
        pvVar19 = (void *)((long)pvVar19 + lVar30);
        uVar21 = uVar20 + 7;
        uVar20 = uVar20 + 4;
      }
      uVar21 = uVar20 | 1;
      while ((int)uVar21 < (int)uVar10) {
        if (0 < (int)uVar1) {
          uVar37 = 0;
          pvVar24 = pvVar19;
          pvVar26 = pvVar49;
          pvVar55 = pvVar12;
          pvVar57 = pvVar60;
          do {
            lVar38 = 0;
            bVar9 = true;
            do {
              bVar42 = bVar9;
              *puVar31 = *(undefined4 *)((long)pvVar57 + lVar38);
              puVar31[1] = *(undefined4 *)((long)pvVar55 + lVar38);
              puVar31[2] = *(undefined4 *)((long)pvVar26 + lVar38);
              puVar31[3] = *(undefined4 *)((long)pvVar24 + lVar38);
              puVar31 = puVar31 + 4;
              lVar38 = lVar38 + lVar35;
              bVar9 = false;
            } while (bVar42);
            uVar37 = uVar37 + 1;
            pvVar24 = (void *)((long)pvVar24 + 4);
            pvVar26 = (void *)((long)pvVar26 + 4);
            pvVar55 = (void *)((long)pvVar55 + 4);
            pvVar57 = (void *)((long)pvVar57 + 4);
          } while (uVar37 != uVar54);
        }
        pvVar60 = (void *)((long)pvVar60 + lVar36);
        pvVar12 = (void *)((long)pvVar12 + lVar36);
        pvVar49 = (void *)((long)pvVar49 + lVar36);
        pvVar19 = (void *)((long)pvVar19 + lVar36);
        uVar21 = uVar20 + 3;
        uVar20 = uVar20 + 2;
      }
      if ((int)uVar20 < (int)uVar10) {
        do {
          if (0 < (int)uVar1) {
            uVar37 = 0;
            do {
              *puVar31 = *(undefined4 *)((long)pvVar60 + uVar37 * 4);
              puVar31[1] = *(undefined4 *)((long)pvVar12 + uVar37 * 4);
              puVar31[2] = *(undefined4 *)((long)pvVar49 + uVar37 * 4);
              puVar31[3] = *(undefined4 *)((long)pvVar19 + uVar37 * 4);
              puVar31 = puVar31 + 4;
              uVar37 = uVar37 + 1;
            } while (uVar54 != uVar37);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar10);
      }
      uVar37 = uVar23 + 4;
      uVar13 = uVar23 + 7;
      uVar50 = uVar13 & 0xffffffff;
      iVar16 = iVar16 + iVar29;
      iVar44 = iVar44 + iVar29;
      iVar17 = iVar17 + iVar29;
      iVar43 = iVar43 + iVar29;
      uVar23 = uVar37;
    } while ((long)uVar13 < (long)uVar45);
  }
  uVar20 = (uint)uVar37 | 1;
  if ((int)uVar20 < (int)uVar11) {
    pvVar2 = (this->super_Convolution1D).weight_data.data;
    sVar4 = (this->weight_data_tm).elemsize;
    sVar5 = (this->weight_data_tm).cstep;
    lVar38 = (long)(int)(uVar1 * 2);
    lVar64 = (long)(int)(uVar1 * 3);
    lVar22 = (long)(int)(uVar1 * 4);
    iVar17 = uVar1 * uVar10 * (uint)uVar37;
    iVar16 = uVar1 * uVar10 * uVar20;
    iVar29 = uVar1 * uVar10 * 2;
    lVar36 = (long)(int)(uVar1 * 8) * 4;
    lVar30 = lVar22 * 4;
    lVar32 = lVar38 * 4;
    pvVar3 = (this->weight_data_tm).data;
    lVar35 = lVar27 * 4;
    uVar50 = uVar37 & 0xffffffff;
    do {
      puVar31 = (undefined4 *)
                ((ulong)(((uint)(uVar50 >> 2) & 1) + ((uint)(uVar50 >> 3) & 0x1fffffff) +
                        (uint)(((uint)uVar50 >> 1 & 1) != 0)) * sVar4 * sVar5 + (long)pvVar3);
      if ((int)uVar10 < 8) {
        local_150 = (void *)((long)pvVar2 + (long)(int)(uVar10 * uVar1 * (uint)uVar50) * 4);
        local_148 = (void *)((long)pvVar2 + (long)(int)(uVar20 * uVar10 * uVar1) * 4);
        uVar20 = 0;
      }
      else {
        lVar14 = (long)iVar16;
        lVar65 = (long)pvVar2 + lVar14 * 4 + (long)(int)(uVar1 * 7) * 4;
        lVar66 = (long)pvVar2 + lVar14 * 4 + (long)(int)(uVar1 * 6) * 4;
        lVar33 = (long)pvVar2 + lVar14 * 4 + (long)(int)(uVar1 * 5) * 4;
        lVar61 = (long)pvVar2 + lVar14 * 4 + lVar22 * 4;
        lVar41 = (long)pvVar2 + lVar14 * 4 + lVar64 * 4;
        lVar56 = (long)pvVar2 + lVar14 * 4 + lVar38 * 4;
        lVar34 = (long)pvVar2 + lVar14 * 4 + lVar27 * 4;
        local_148 = (void *)((long)pvVar2 + lVar14 * 4);
        lVar47 = (long)iVar17;
        lVar14 = (long)pvVar2 + lVar47 * 4 + (long)(int)(uVar1 * 7) * 4;
        lVar25 = (long)pvVar2 + lVar47 * 4 + (long)(int)(uVar1 * 6) * 4;
        lVar58 = (long)pvVar2 + lVar47 * 4 + (long)(int)(uVar1 * 5) * 4;
        lVar28 = (long)pvVar2 + lVar47 * 4 + lVar22 * 4;
        local_118 = (long)pvVar2 + lVar47 * 4 + lVar64 * 4;
        local_108 = (long)pvVar2 + lVar47 * 4 + lVar38 * 4;
        lVar48 = (long)pvVar2 + lVar47 * 4 + lVar27 * 4;
        local_150 = (void *)((long)pvVar2 + lVar47 * 4);
        iVar43 = 0;
        do {
          if (0 < (int)uVar1) {
            lVar47 = 0;
            do {
              *puVar31 = *(undefined4 *)((long)local_150 + lVar47);
              puVar31[1] = *(undefined4 *)(lVar48 + lVar47);
              puVar31[2] = *(undefined4 *)(local_108 + lVar47);
              puVar31[3] = *(undefined4 *)(local_118 + lVar47);
              puVar31[4] = *(undefined4 *)(lVar28 + lVar47);
              puVar31[5] = *(undefined4 *)(lVar58 + lVar47);
              puVar31[6] = *(undefined4 *)(lVar25 + lVar47);
              puVar31[7] = *(undefined4 *)(lVar14 + lVar47);
              puVar31[8] = *(undefined4 *)((long)local_148 + lVar47);
              puVar31[9] = *(undefined4 *)(lVar34 + lVar47);
              puVar31[10] = *(undefined4 *)(lVar56 + lVar47);
              puVar31[0xb] = *(undefined4 *)(lVar41 + lVar47);
              puVar31[0xc] = *(undefined4 *)(lVar61 + lVar47);
              puVar31[0xd] = *(undefined4 *)(lVar33 + lVar47);
              puVar31[0xe] = *(undefined4 *)(lVar66 + lVar47);
              puVar31[0xf] = *(undefined4 *)(lVar65 + lVar47);
              puVar31 = puVar31 + 0x10;
              lVar47 = lVar47 + 4;
            } while (uVar54 * 4 != lVar47);
          }
          local_150 = (void *)((long)local_150 + lVar36);
          local_148 = (void *)((long)local_148 + lVar36);
          iVar51 = iVar43 + 0xf;
          lVar65 = lVar65 + lVar36;
          lVar66 = lVar66 + lVar36;
          lVar33 = lVar33 + lVar36;
          lVar61 = lVar61 + lVar36;
          lVar41 = lVar41 + lVar36;
          lVar56 = lVar56 + lVar36;
          lVar34 = lVar34 + lVar36;
          lVar14 = lVar14 + lVar36;
          lVar25 = lVar25 + lVar36;
          lVar58 = lVar58 + lVar36;
          lVar28 = lVar28 + lVar36;
          local_118 = local_118 + lVar36;
          local_108 = local_108 + lVar36;
          lVar48 = lVar48 + lVar36;
          uVar20 = uVar10 & 0xfffffff8;
          iVar43 = iVar43 + 8;
        } while (iVar51 < (int)uVar10);
      }
      if ((int)(uVar20 | 3) < (int)uVar10) {
        pvVar60 = (void *)((long)local_148 + lVar64 * 4);
        pvVar12 = (void *)((long)local_148 + lVar32);
        pvVar49 = (void *)((long)local_148 + lVar35);
        pvVar26 = (void *)(lVar64 * 4 + (long)local_150);
        pvVar19 = (void *)((long)local_150 + lVar32);
        pvVar24 = (void *)((long)local_150 + lVar35);
        uVar21 = uVar20;
        do {
          if (0 < (int)uVar1) {
            lVar65 = 0;
            puVar59 = puVar31;
            do {
              puVar15 = puVar59;
              puVar59 = puVar31 + lVar65 * 2;
              *puVar59 = *(undefined4 *)((long)local_150 + lVar65);
              puVar59[1] = *(undefined4 *)((long)pvVar24 + lVar65);
              puVar59[2] = *(undefined4 *)((long)pvVar19 + lVar65);
              puVar59[3] = *(undefined4 *)((long)pvVar26 + lVar65);
              puVar59[4] = *(undefined4 *)((long)local_148 + lVar65);
              puVar59[5] = *(undefined4 *)((long)pvVar49 + lVar65);
              puVar59[6] = *(undefined4 *)((long)pvVar12 + lVar65);
              puVar59[7] = *(undefined4 *)((long)pvVar60 + lVar65);
              lVar65 = lVar65 + 4;
              puVar59 = puVar59 + 8;
            } while (uVar54 * 4 != lVar65);
            puVar31 = puVar15 + 8;
          }
          local_150 = (void *)((long)local_150 + lVar30);
          local_148 = (void *)((long)local_148 + lVar30);
          uVar20 = uVar21 + 4;
          iVar43 = uVar21 + 7;
          pvVar60 = (void *)((long)pvVar60 + lVar30);
          pvVar12 = (void *)((long)pvVar12 + lVar30);
          pvVar49 = (void *)((long)pvVar49 + lVar30);
          pvVar26 = (void *)((long)pvVar26 + lVar30);
          pvVar19 = (void *)((long)pvVar19 + lVar30);
          pvVar24 = (void *)((long)pvVar24 + lVar30);
          uVar21 = uVar20;
        } while (iVar43 < (int)uVar10);
      }
      uVar21 = uVar20 | 1;
      while ((int)uVar21 < (int)uVar10) {
        if (0 < (int)uVar1) {
          uVar37 = 0;
          pvVar60 = local_150;
          pvVar12 = local_148;
          do {
            lVar65 = 0;
            bVar9 = true;
            do {
              bVar42 = bVar9;
              *puVar31 = *(undefined4 *)((long)pvVar60 + lVar65);
              puVar31[1] = *(undefined4 *)((long)pvVar12 + lVar65);
              puVar31 = puVar31 + 2;
              lVar65 = lVar65 + lVar35;
              bVar9 = false;
            } while (bVar42);
            uVar37 = uVar37 + 1;
            pvVar12 = (void *)((long)pvVar12 + 4);
            pvVar60 = (void *)((long)pvVar60 + 4);
          } while (uVar37 != uVar54);
        }
        local_150 = (void *)((long)local_150 + lVar32);
        local_148 = (void *)((long)local_148 + lVar32);
        uVar21 = uVar20 + 3;
        uVar20 = uVar20 + 2;
      }
      if ((int)uVar20 < (int)uVar10) {
        do {
          if (0 < (int)uVar1) {
            uVar37 = 0;
            do {
              *puVar31 = *(undefined4 *)((long)local_150 + uVar37 * 4);
              puVar31[1] = *(undefined4 *)((long)local_148 + uVar37 * 4);
              puVar31 = puVar31 + 2;
              uVar37 = uVar37 + 1;
            } while (uVar54 != uVar37);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar10);
      }
      uVar37 = uVar50 + 2;
      lVar65 = uVar50 + 3;
      uVar20 = (uint)lVar65;
      iVar16 = iVar16 + iVar29;
      iVar17 = iVar17 + iVar29;
      uVar50 = uVar37;
    } while (lVar65 < (long)uVar45);
  }
  iVar29 = (int)uVar37;
  if (iVar29 < (int)uVar11) {
    pvVar2 = (this->super_Convolution1D).weight_data.data;
    pvVar3 = (this->weight_data_tm).data;
    sVar4 = (this->weight_data_tm).elemsize;
    sVar5 = (this->weight_data_tm).cstep;
    uVar37 = (ulong)iVar29;
    iVar29 = uVar1 * uVar10 * iVar29;
    do {
      uVar11 = (uint)uVar37;
      puVar31 = (undefined4 *)
                ((ulong)((uVar11 & 1) + ((uint)(uVar37 >> 3) & 0x1fffffff) +
                         ((uint)(uVar37 >> 2) & 1) + (uint)((uVar11 >> 1 & 1) != 0)) * sVar4 * sVar5
                + (long)pvVar3);
      if ((int)uVar10 < 8) {
        puVar59 = (undefined4 *)((long)pvVar2 + (long)(int)(uVar10 * uVar1 * uVar11) * 4);
        uVar50 = 0;
      }
      else {
        puVar59 = (undefined4 *)((long)pvVar2 + (long)iVar29 * 4);
        iVar16 = 0;
        do {
          if (0 < (int)uVar1) {
            uVar50 = 0;
            puVar15 = puVar59;
            do {
              puVar53 = puVar31;
              lVar35 = 0;
              puVar31 = puVar15;
              do {
                *(undefined4 *)((long)puVar53 + lVar35) = *puVar31;
                lVar35 = lVar35 + 4;
                puVar31 = puVar31 + lVar27;
              } while ((int)lVar35 != 0x20);
              uVar50 = uVar50 + 1;
              puVar15 = puVar15 + 1;
              puVar31 = (undefined4 *)((long)puVar53 + lVar35);
            } while (uVar50 != uVar54);
            puVar31 = (undefined4 *)((long)puVar53 + lVar35);
          }
          puVar59 = puVar59 + (int)(uVar1 * 8);
          iVar17 = iVar16 + 0xf;
          iVar16 = iVar16 + 8;
        } while (iVar17 < (int)uVar10);
        uVar50 = uVar8 & 0xfffffff8;
      }
      uVar11 = (uint)uVar50 | 3;
      while (uVar20 = (uint)uVar50, (int)uVar11 < (int)uVar10) {
        if (0 < (int)uVar1) {
          uVar50 = 0;
          puVar15 = puVar59;
          do {
            puVar53 = puVar31;
            lVar35 = 0;
            puVar31 = puVar15;
            do {
              *(undefined4 *)((long)puVar53 + lVar35) = *puVar31;
              lVar35 = lVar35 + 4;
              puVar31 = puVar31 + lVar27;
            } while ((int)lVar35 != 0x10);
            uVar50 = uVar50 + 1;
            puVar15 = puVar15 + 1;
            puVar31 = (undefined4 *)((long)puVar53 + lVar35);
          } while (uVar50 != uVar54);
          puVar31 = (undefined4 *)((long)puVar53 + lVar35);
        }
        puVar59 = puVar59 + (int)(uVar1 * 4);
        uVar50 = (ulong)(uVar20 + 4);
        uVar11 = uVar20 + 7;
      }
      if ((int)(uVar20 | 1) < (int)uVar10) {
        puVar15 = puVar59 + lVar27;
        do {
          if (0 < (int)uVar1) {
            uVar23 = 0;
            do {
              *puVar31 = puVar59[uVar23];
              puVar31[1] = puVar15[uVar23];
              puVar31 = puVar31 + 2;
              uVar23 = uVar23 + 1;
            } while (uVar54 != uVar23);
          }
          puVar59 = puVar59 + (int)(uVar1 * 2);
          iVar16 = (int)uVar50;
          uVar50 = (ulong)(iVar16 + 2);
          puVar15 = puVar15 + (int)(uVar1 * 2);
        } while (iVar16 + 3 < (int)uVar10);
      }
      if ((int)uVar50 < (int)uVar10) {
        do {
          if (0 < (int)uVar1) {
            lVar35 = 0;
            do {
              *(undefined4 *)((long)puVar31 + lVar35) = *(undefined4 *)((long)puVar59 + lVar35);
              lVar35 = lVar35 + 4;
            } while (uVar54 * 4 - lVar35 != 0);
            puVar31 = (undefined4 *)((long)puVar31 + lVar35);
          }
          uVar11 = (int)uVar50 + 1;
          uVar50 = (ulong)uVar11;
        } while (uVar11 != uVar10);
      }
      uVar37 = uVar37 + 1;
      iVar29 = iVar29 + uVar1 * uVar10;
    } while (uVar37 != uVar45);
  }
  if (opt->lightmode == true) {
    piVar6 = (this->super_Convolution1D).weight_data.refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        pvVar2 = (this->super_Convolution1D).weight_data.data;
        pAVar7 = (this->super_Convolution1D).weight_data.allocator;
        if (pAVar7 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (*pAVar7->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution1D).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_Convolution1D).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_Convolution1D).weight_data.elemsize + 4) = 0;
    (this->super_Convolution1D).weight_data.data = (void *)0x0;
    (this->super_Convolution1D).weight_data.refcount = (int *)0x0;
    (this->super_Convolution1D).weight_data.dims = 0;
    (this->super_Convolution1D).weight_data.w = 0;
    (this->super_Convolution1D).weight_data.h = 0;
    (this->super_Convolution1D).weight_data.d = 0;
    (this->super_Convolution1D).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution1D_x86_avx::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}